

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_A_ParamSet.c
# Opt level: O3

void fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_sub(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  
  uVar1 = arg1[4];
  uVar2 = arg2[4];
  uVar3 = arg1[1];
  uVar4 = arg1[2];
  uVar5 = arg1[3];
  uVar6 = arg2[1];
  uVar7 = arg2[2];
  uVar8 = arg2[3];
  *out1 = (*arg1 - *arg2) + 0x1ffffffffffb2e;
  out1[1] = (uVar3 - uVar6) + 0xffffffffffffe;
  out1[2] = (uVar4 - uVar7) + 0xffffffffffffe;
  out1[3] = (uVar5 - uVar8) + 0xffffffffffffe;
  out1[4] = (uVar1 - uVar2) + 0xffffffffffffe;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_A_ParamSet_sub(
    uint64_t out1[5], const uint64_t arg1[5], const uint64_t arg2[5]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    x1 = ((UINT64_C(0x1ffffffffffb2e) + (arg1[0])) - (arg2[0]));
    x2 = ((UINT64_C(0xffffffffffffe) + (arg1[1])) - (arg2[1]));
    x3 = ((UINT64_C(0xffffffffffffe) + (arg1[2])) - (arg2[2]));
    x4 = ((UINT64_C(0xffffffffffffe) + (arg1[3])) - (arg2[3]));
    x5 = ((UINT64_C(0xffffffffffffe) + (arg1[4])) - (arg2[4]));
    out1[0] = x1;
    out1[1] = x2;
    out1[2] = x3;
    out1[3] = x4;
    out1[4] = x5;
}